

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_convex_poly.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_ConvexHullRef::Vertex(ON_3dVector *__return_storage_ptr__,ON_ConvexHullRef *this,int j)

{
  double *pdVar1;
  long lVar2;
  double xx;
  double yy;
  double zz;
  ON_3dVector local_50;
  undefined1 local_38 [8];
  ON_4dPoint hv;
  int j_local;
  ON_ConvexHullRef *this_local;
  
  if ((this->m_is_rat & 1U) == 0) {
    pdVar1 = this->m_v;
    lVar2 = (long)(this->m_stride * j);
    __return_storage_ptr__->x = pdVar1[lVar2];
    __return_storage_ptr__->y = pdVar1[lVar2 + 1];
    __return_storage_ptr__->z = pdVar1[lVar2 + 2];
  }
  else {
    pdVar1 = this->m_v;
    lVar2 = (long)(this->m_stride * j);
    local_38 = (undefined1  [8])pdVar1[lVar2];
    hv.x = pdVar1[lVar2 + 1];
    hv.y = pdVar1[lVar2 + 2];
    hv.z = pdVar1[lVar2 + 3];
    hv.w._4_4_ = j;
    xx = ON_4dPoint::EuclideanX((ON_4dPoint *)local_38);
    yy = ON_4dPoint::EuclideanY((ON_4dPoint *)local_38);
    zz = ON_4dPoint::EuclideanZ((ON_4dPoint *)local_38);
    ON_3dVector::ON_3dVector(&local_50,xx,yy,zz);
    __return_storage_ptr__->x = local_50.x;
    __return_storage_ptr__->y = local_50.y;
    __return_storage_ptr__->z = local_50.z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_ConvexHullRef::Vertex(int j) const
{
  ON_3dVector v;
  if (m_is_rat)
  {
    ON_4dPoint hv = *(reinterpret_cast<const ON_4dPoint*>(m_v + m_stride*j));
    v = ON_3dVector(hv.EuclideanX(), hv.EuclideanY(), hv.EuclideanZ());
  }
  else
  {
    v = *(reinterpret_cast<const ON_3dVector*>(m_v + m_stride*j));
  }
  return v;
}